

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputPFBDecodeStream.cpp
# Opt level: O3

void __thiscall InputPFBDecodeStream::SkipTillToken(InputPFBDecodeStream *this)

{
  Byte *pBVar1;
  byte bVar2;
  int iVar3;
  EStatusCode EVar4;
  ulong uVar5;
  Byte buffer;
  Byte local_19;
  
  local_19 = '\0';
  if ((this->mInternalState == eSuccess) &&
     (iVar3 = (*(this->super_IByteReader)._vptr_IByteReader[3])(), (char)iVar3 != '\0')) {
    do {
      bVar2 = this->mHasTokenBuffer;
      if ((bool)bVar2 == false) {
        if (this->mSegmentSize <= this->mInSegmentReadIndex) {
          return;
        }
        iVar3 = (*this->mStreamToDecode->_vptr_IByteReader[3])();
        if ((char)iVar3 == '\0') {
          return;
        }
        bVar2 = this->mHasTokenBuffer;
      }
      if ((bVar2 & 1) == 0) {
        EVar4 = (*this->mDecodeMethod)(this,&local_19);
        if (EVar4 != eSuccess) {
          return;
        }
      }
      else {
        local_19 = this->mTokenBuffer;
        this->mHasTokenBuffer = false;
      }
      uVar5 = 0;
      do {
        pBVar1 = "" + uVar5;
        if (4 < uVar5) break;
        uVar5 = uVar5 + 1;
      } while (*pBVar1 != local_19);
    } while (*pBVar1 == local_19);
    this->mHasTokenBuffer = true;
    this->mTokenBuffer = local_19;
  }
  return;
}

Assistant:

void InputPFBDecodeStream::SkipTillToken()
{
	Byte buffer = 0;

	if(mInternalState != PDFHummus::eSuccess || !NotEnded())
		return;

	// skip till hitting first non space, or segment end
	while(IsSegmentNotEnded())
	{
		if(GetNextByteForToken(buffer) != PDFHummus::eSuccess)
			break;

		if(!IsPostScriptWhiteSpace(buffer))
		{
			SaveTokenBuffer(buffer);
			break;
		}
	}
}